

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O0

void duckdb::BitpackingCompressionState<duckdb::uhugeint_t,_true,_duckdb::hugeint_t>::
     BitpackingWriter::WriteFor
               (uhugeint_t *values,bool *validity,bitpacking_width_t width,
               uhugeint_t frame_of_reference,idx_t count,void *data_ptr)

{
  BitpackingCompressionState<duckdb::uhugeint_t,_true,_duckdb::hugeint_t> *state_00;
  BitpackingWriter *this;
  data_ptr_t *in_RCX;
  data_ptr_t *ppdVar1;
  byte in_DL;
  uint64_t in_R8;
  uhugeint_t val;
  uhugeint_t val_00;
  long in_stack_00000008;
  idx_t bp_size;
  BitpackingCompressionState<duckdb::uhugeint_t,_true,_duckdb::hugeint_t> *state;
  bitpacking_width_t in_stack_000001cf;
  idx_t in_stack_000001d0;
  uhugeint_t *in_stack_000001d8;
  data_ptr_t in_stack_000001e0;
  idx_t in_stack_ffffffffffffff98;
  BitpackingCompressionState<duckdb::uhugeint_t,_true,_duckdb::hugeint_t> *in_stack_ffffffffffffffa0
  ;
  undefined7 local_58;
  BitpackingMode in_stack_ffffffffffffffaf;
  BitpackingCompressionState<duckdb::uhugeint_t,_true,_duckdb::hugeint_t> *in_stack_ffffffffffffffb0
  ;
  
  ppdVar1 = in_RCX;
  state_00 = (BitpackingCompressionState<duckdb::uhugeint_t,_true,_duckdb::hugeint_t> *)
             BitpackingPrimitives::GetRequiredSize
                       ((idx_t)in_stack_ffffffffffffffa0,
                        (bitpacking_width_t)(in_stack_ffffffffffffff98 >> 0x38));
  ReserveSpace(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  WriteMetaData(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffaf);
  val.upper = (uint64_t)ppdVar1;
  val.lower = in_R8;
  WriteData<duckdb::uhugeint_t>((BitpackingWriter *)(in_stack_00000008 + 0x40),in_RCX,val);
  this = (BitpackingWriter *)(in_stack_00000008 + 0x40);
  uhugeint_t::uhugeint_t((uhugeint_t *)&stack0xffffffffffffffa0,(ulong)in_DL);
  val_00.lower._7_1_ = in_stack_ffffffffffffffaf;
  val_00.lower._0_7_ = local_58;
  val_00.upper = (uint64_t)ppdVar1;
  WriteData<duckdb::uhugeint_t>(this,(data_ptr_t *)in_stack_ffffffffffffffa0,val_00);
  BitpackingPrimitives::PackBuffer<duckdb::uhugeint_t,false>
            (in_stack_000001e0,in_stack_000001d8,in_stack_000001d0,in_stack_000001cf);
  *(long *)(in_stack_00000008 + 0x40) =
       (long)((state_00->state).compression_buffer_internal + -5) +
       *(long *)(in_stack_00000008 + 0x40);
  UpdateStats(state_00,in_R8);
  return;
}

Assistant:

static void WriteFor(T *values, bool *validity, bitpacking_width_t width, T frame_of_reference, idx_t count,
		                     void *data_ptr) {
			auto state = reinterpret_cast<BitpackingCompressionState<T, WRITE_STATISTICS> *>(data_ptr);

			auto bp_size = BitpackingPrimitives::GetRequiredSize(count, width);
			ReserveSpace(state, bp_size + 2 * sizeof(T));

			WriteMetaData(state, BitpackingMode::FOR);
			WriteData(state->data_ptr, frame_of_reference);
			WriteData(state->data_ptr, (T)width);

			BitpackingPrimitives::PackBuffer<T, false>(state->data_ptr, values, count, width);
			state->data_ptr += bp_size;

			UpdateStats(state, count);
		}